

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbdCore.c
# Opt level: O2

void Sbd_ManDeriveMapping_rec(Sbd_Man_t *p,Gia_Man_t *pNew,int iObj)

{
  int iVar1;
  uint uVar2;
  Gia_Obj_t *pGVar3;
  int *piVar4;
  long lVar5;
  
  if (iObj != 0) {
    iVar1 = Gia_ObjIsTravIdCurrentId(pNew,iObj);
    if (iVar1 == 0) {
      Gia_ObjSetTravIdCurrentId(pNew,iObj);
      pGVar3 = Gia_ManObj(pNew,iObj);
      uVar2 = (uint)*(undefined8 *)pGVar3;
      if ((~uVar2 & 0x9fffffff) != 0) {
        if ((-1 < (int)uVar2) && ((uVar2 & 0x1fffffff) != 0x1fffffff)) {
          piVar4 = Sbd_ObjCut2(p,iObj);
          for (lVar5 = 1; lVar5 <= *piVar4; lVar5 = lVar5 + 1) {
            Sbd_ManDeriveMapping_rec(p,pNew,piVar4[lVar5]);
          }
          Vec_IntWriteEntry(pNew->vMapping,iObj,pNew->vMapping->nSize);
          for (lVar5 = 0; lVar5 <= *piVar4; lVar5 = lVar5 + 1) {
            Vec_IntPush(pNew->vMapping,piVar4[lVar5]);
          }
          Vec_IntPush(pNew->vMapping,iObj);
          return;
        }
        __assert_fail("Gia_ObjIsAnd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sbd/sbdCore.c"
                      ,0x7a2,"void Sbd_ManDeriveMapping_rec(Sbd_Man_t *, Gia_Man_t *, int)");
      }
    }
  }
  return;
}

Assistant:

void Sbd_ManDeriveMapping_rec( Sbd_Man_t * p, Gia_Man_t * pNew, int iObj )
{
    Gia_Obj_t * pObj; int k, * pCut;
    if ( !iObj || Gia_ObjIsTravIdCurrentId(pNew, iObj) )
        return;
    Gia_ObjSetTravIdCurrentId(pNew, iObj);
    pObj = Gia_ManObj( pNew, iObj );
    if ( Gia_ObjIsCi(pObj) )
        return;
    assert( Gia_ObjIsAnd(pObj) );
    pCut = Sbd_ObjCut2( p, iObj );
    for ( k = 1; k <= pCut[0]; k++ )
        Sbd_ManDeriveMapping_rec( p, pNew, pCut[k] );
    // add mapping
    Vec_IntWriteEntry( pNew->vMapping, iObj, Vec_IntSize(pNew->vMapping) );
    for ( k = 0; k <= pCut[0]; k++ )
        Vec_IntPush( pNew->vMapping, pCut[k] );
    Vec_IntPush( pNew->vMapping, iObj );
}